

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

RawBrandedSchema * __thiscall
capnp::SchemaLoader::Impl::makeBranded
          (Impl *this,RawSchema *schema,Reader proto,
          Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *clientBrand)

{
  uint64_t *puVar1;
  Scope *pSVar2;
  undefined8 uVar3;
  Reader type;
  Scope *__return_storage_ptr__;
  ulong uVar4;
  Binding *pBVar5;
  uint64_t uVar6;
  RawBrandedSchema *pRVar7;
  Scope *__i;
  Scope *pSVar8;
  long lVar9;
  unsigned_long j;
  ulong uVar10;
  Binding *result;
  ulong uVar11;
  Reader RVar12;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Binding> AVar13;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> AVar14;
  StringPtr scopeName;
  Array<capnp::_::RawBrandedSchema::Binding> dstBindings_heap;
  Array<capnp::_::RawBrandedSchema::Scope> dstScopes_heap;
  Reader srcScope;
  Reader srcBinding;
  Reader srcBindings;
  Reader srcScopes;
  Binding dstBindings_stack [16];
  Scope dstScopes_stack [16];
  uint local_464;
  Array<capnp::_::RawBrandedSchema::Binding> local_438;
  Array<capnp::_::RawBrandedSchema::Scope> local_418;
  RawSchema *local_3f8;
  ulong local_3f0;
  anon_union_16_1_a8c68091_for_NullableValue<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>_2
  *local_3e8;
  size_t local_3e0;
  char *local_3d8;
  IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
  local_3d0;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_3c0;
  Reader local_3a8;
  Reader local_378;
  StructReader local_348;
  ListReader local_318;
  Reader local_2e8;
  Binding local_2b8 [16];
  Scope local_1b8 [16];
  
  __return_storage_ptr__ = local_1b8;
  local_3f8 = schema;
  readMessageUnchecked<capnp::schema::Node>((Reader *)__return_storage_ptr__,schema->encodedNode);
  RVar12 = capnp::schema::Node::Reader::getDisplayName((Reader *)__return_storage_ptr__);
  local_3e0 = RVar12.super_StringPtr.content.size_;
  local_3d8 = RVar12.super_StringPtr.content.ptr;
  capnp::schema::Brand::Reader::getScopes(&local_2e8,&proto);
  uVar4 = (ulong)local_2e8.reader.elementCount;
  if (uVar4 < 0x11) {
    local_418.ptr = (Scope *)0x0;
    local_418.size_ = 0;
    local_418.disposer = (ArrayDisposer *)0x0;
  }
  else {
    __return_storage_ptr__ =
         kj::_::HeapArrayDisposer::allocate<capnp::_::RawBrandedSchema::Scope>(uVar4);
    local_418.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    local_418.ptr = __return_storage_ptr__;
    local_418.size_ = uVar4;
  }
  memset(__return_storage_ptr__,0,uVar4 * 0x18);
  local_3d0.index = 0;
  local_3e8 = &(clientBrand->ptr).field_1;
  local_464 = 0;
  local_3d0.container = &local_2e8;
  do {
    uVar4 = (ulong)local_464;
    if (local_3d0.index == local_2e8.reader.elementCount) {
      if (local_464 != 0) {
        lVar9 = 0x3f;
        if (uVar4 != 0) {
          for (; local_464 >> lVar9 == 0; lVar9 = lVar9 + -1) {
          }
        }
        std::
        __introsort_loop<capnp::_::RawBrandedSchema::Scope*,long,__gnu_cxx::__ops::_Iter_comp_iter<capnp::SchemaLoader::Impl::makeBranded(capnp::_::RawSchema_const*,capnp::schema::Brand::Reader,kj::Maybe<kj::ArrayPtr<capnp::_::RawBrandedSchema::Scope_const>>)::__0>>
                  (__return_storage_ptr__,__return_storage_ptr__ + uVar4,
                   ((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
        if (local_464 < 0x11) {
          std::
          __insertion_sort<capnp::_::RawBrandedSchema::Scope*,__gnu_cxx::__ops::_Iter_comp_iter<capnp::SchemaLoader::Impl::makeBranded(capnp::_::RawSchema_const*,capnp::schema::Brand::Reader,kj::Maybe<kj::ArrayPtr<capnp::_::RawBrandedSchema::Scope_const>>)::__0>>
                    (__return_storage_ptr__,__return_storage_ptr__ + uVar4);
        }
        else {
          pSVar8 = __return_storage_ptr__ + 0x10;
          std::
          __insertion_sort<capnp::_::RawBrandedSchema::Scope*,__gnu_cxx::__ops::_Iter_comp_iter<capnp::SchemaLoader::Impl::makeBranded(capnp::_::RawSchema_const*,capnp::schema::Brand::Reader,kj::Maybe<kj::ArrayPtr<capnp::_::RawBrandedSchema::Scope_const>>)::__0>>
                    (__return_storage_ptr__,pSVar8);
          for (lVar9 = uVar4 * 0x18 + -0x180; lVar9 != 0; lVar9 = lVar9 + -0x18) {
            std::
            __unguarded_linear_insert<capnp::_::RawBrandedSchema::Scope*,__gnu_cxx::__ops::_Val_comp_iter<capnp::SchemaLoader::Impl::makeBranded(capnp::_::RawSchema_const*,capnp::schema::Brand::Reader,kj::Maybe<kj::ArrayPtr<capnp::_::RawBrandedSchema::Scope_const>>)::__0>>
                      (pSVar8);
            pSVar8 = pSVar8 + 1;
          }
        }
      }
      AVar14.size_._0_4_ = local_464;
      AVar14.ptr = __return_storage_ptr__;
      AVar14.size_._4_4_ = 0;
      AVar14 = copyDeduped<capnp::_::RawBrandedSchema::Scope>(this,AVar14);
      pRVar7 = makeBranded(this,local_3f8,AVar14);
      kj::Array<capnp::_::RawBrandedSchema::Scope>::~Array(&local_418);
      return pRVar7;
    }
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
    ::operator*(&local_3a8,&local_3d0);
    if (local_3a8._reader.dataSize < 0x50) {
LAB_00192e7b:
      capnp::schema::Brand::Scope::Reader::getBind((Reader *)&local_318,&local_3a8);
      uVar10 = (ulong)local_318.elementCount;
      if (uVar10 < 0x11) {
        local_438.ptr = (Binding *)0x0;
        local_438.size_ = 0;
        local_438.disposer = (ArrayDisposer *)0x0;
        pBVar5 = local_2b8;
      }
      else {
        pBVar5 = kj::_::HeapArrayDisposer::allocate<capnp::_::RawBrandedSchema::Binding>(uVar10);
        local_438.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
        local_438.ptr = pBVar5;
        local_438.size_ = uVar10;
      }
      local_3f0 = uVar10;
      memset(pBVar5,0,uVar10 << 4);
      uVar11 = (ulong)local_318.elementCount;
      result = pBVar5;
      for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
        capnp::_::ListReader::getStructElement(&local_348,&local_318,(ElementCount)uVar10);
        result->which = '\0';
        result->isImplicitParameter = false;
        result->listDepth = 0;
        result->paramIndex = 0;
        *(undefined2 *)&result->field_0x6 = 0;
        (result->field_4).schema = (RawBrandedSchema *)0x0;
        result->which = '\x12';
        if ((0xf < local_348.dataSize) && (*local_348.data == 1)) {
          capnp::schema::Brand::Binding::Reader::getType(&local_378,(Reader *)&local_348);
          local_3c0.ptr.isSet = (clientBrand->ptr).isSet;
          if (local_3c0.ptr.isSet == true) {
            local_3c0.ptr.field_1.value.ptr = (local_3e8->value).ptr;
            local_3c0.ptr.field_1.value.size_ = (local_3e8->value).size_;
          }
          type._reader.capTable = local_378._reader.capTable;
          type._reader.segment = local_378._reader.segment;
          type._reader.data = local_378._reader.data;
          type._reader.pointers = local_378._reader.pointers;
          type._reader.dataSize = local_378._reader.dataSize;
          type._reader.pointerCount = local_378._reader.pointerCount;
          type._reader._38_2_ = local_378._reader._38_2_;
          type._reader.nestingLimit = local_378._reader.nestingLimit;
          type._reader._44_4_ = local_378._reader._44_4_;
          scopeName.content.size_ = local_3e0;
          scopeName.content.ptr = local_3d8;
          makeDep(this,result,type,scopeName,&local_3c0);
        }
        result = result + 1;
      }
      if (local_3a8._reader.dataSize < 0x40) {
        uVar6 = 0;
      }
      else {
        uVar6 = *local_3a8._reader.data;
      }
      pSVar8 = __return_storage_ptr__ + uVar4;
      pSVar8->typeId = uVar6;
      pSVar8->bindingCount = (uint)local_3f0;
      AVar13.size_ = local_3f0;
      AVar13.ptr = pBVar5;
      AVar13 = copyDeduped<capnp::_::RawBrandedSchema::Binding>(this,AVar13);
      local_464 = local_464 + 1;
      pSVar8->bindings = AVar13.ptr;
      kj::Array<capnp::_::RawBrandedSchema::Binding>::~Array(&local_438);
    }
    else {
      if ((short)*(uint64_t *)((long)local_3a8._reader.data + 8) == 0) goto LAB_00192e7b;
      if ((short)*(uint64_t *)((long)local_3a8._reader.data + 8) == 1) {
        local_464 = local_464 + 1;
        pSVar8 = __return_storage_ptr__ + uVar4;
        uVar6 = *local_3a8._reader.data;
        __return_storage_ptr__[uVar4].typeId = uVar6;
        if ((clientBrand->ptr).isSet == true) {
          pSVar2 = (clientBrand->ptr).field_1.value.ptr;
          for (lVar9 = 0; (clientBrand->ptr).field_1.value.size_ * 0x18 - lVar9 != 0;
              lVar9 = lVar9 + 0x18) {
            if (*(uint64_t *)((long)&pSVar2->typeId + lVar9) == uVar6) {
              uVar3 = *(undefined8 *)((long)&pSVar2->bindingCount + lVar9);
              pSVar8->bindingCount = (int)uVar3;
              pSVar8->isUnbound = (bool)(char)((ulong)uVar3 >> 0x20);
              *(int3 *)&pSVar8->field_0x15 = (int3)((ulong)uVar3 >> 0x28);
              puVar1 = (uint64_t *)((long)&pSVar2->typeId + lVar9);
              pBVar5 = (Binding *)puVar1[1];
              pSVar8->typeId = *puVar1;
              pSVar8->bindings = pBVar5;
              break;
            }
          }
        }
        else {
          pSVar8->isUnbound = true;
        }
      }
    }
    local_3d0.index = local_3d0.index + 1;
  } while( true );
}

Assistant:

const _::RawBrandedSchema* SchemaLoader::Impl::makeBranded(
    const _::RawSchema* schema, schema::Brand::Reader proto,
    kj::Maybe<kj::ArrayPtr<const _::RawBrandedSchema::Scope>> clientBrand) {
  kj::StringPtr scopeName =
      readMessageUnchecked<schema::Node>(schema->encodedNode).getDisplayName();

  auto srcScopes = proto.getScopes();

  KJ_STACK_ARRAY(_::RawBrandedSchema::Scope, dstScopes, srcScopes.size(), 16, 32);
  memset(dstScopes.begin(), 0, dstScopes.size() * sizeof(dstScopes[0]));

  uint dstScopeCount = 0;
  for (auto srcScope: srcScopes) {
    switch (srcScope.which()) {
      case schema::Brand::Scope::BIND: {
        auto srcBindings = srcScope.getBind();
        KJ_STACK_ARRAY(_::RawBrandedSchema::Binding, dstBindings, srcBindings.size(), 16, 32);
        memset(dstBindings.begin(), 0, dstBindings.size() * sizeof(dstBindings[0]));

        for (auto j: kj::indices(srcBindings)) {
          auto srcBinding = srcBindings[j];
          auto& dstBinding = dstBindings[j];

          memset(&dstBinding, 0, sizeof(dstBinding));
          dstBinding.which = schema::Type::ANY_POINTER;

          switch (srcBinding.which()) {
            case schema::Brand::Binding::UNBOUND:
              break;
            case schema::Brand::Binding::TYPE: {
              makeDep(dstBinding, srcBinding.getType(), scopeName, clientBrand);
              break;
            }
          }
        }

        auto& dstScope = dstScopes[dstScopeCount++];
        dstScope.typeId = srcScope.getScopeId();
        dstScope.bindingCount = dstBindings.size();
        dstScope.bindings = copyDeduped(dstBindings).begin();
        break;
      }
      case schema::Brand::Scope::INHERIT: {
        // Inherit the whole scope from the client -- or if the client doesn't have it, at least
        // include an empty dstScope in the list just to show that this scope was specified as
        // inherited, as opposed to being unspecified (which would be treated as all AnyPointer).
        auto& dstScope = dstScopes[dstScopeCount++];
        dstScope.typeId = srcScope.getScopeId();

        KJ_IF_SOME(b, clientBrand) {
          for (auto& clientScope: b) {
            if (clientScope.typeId == dstScope.typeId) {
              // Overwrite the whole thing.
              dstScope = clientScope;
              break;
            }
          }
        } else {
          dstScope.isUnbound = true;
        }
        break;
      }
    }
  }